

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifc_struct_defs.c
# Opt level: O1

uint16_t ll_gw_scan_result_serialize
                   (llabs_gateway_scan_results_t scan_result,uint8_t num_gw,uint8_t *buff)

{
  *buff = num_gw;
  buff[1] = scan_result.id._7_1_;
  buff[2] = scan_result.id._6_1_;
  buff[3] = scan_result.id._5_1_;
  buff[4] = scan_result.id._4_1_;
  buff[5] = scan_result.id._3_1_;
  buff[6] = scan_result.id._2_1_;
  buff[7] = scan_result.id._1_1_;
  buff[8] = (uint8_t)scan_result.id;
  buff[9] = scan_result.rssi._1_1_;
  buff[10] = (uint8_t)scan_result.rssi;
  buff[0xb] = scan_result.snr;
  buff[0xc] = scan_result.channel;
  buff[0xd] = scan_result.is_repeater;
  return 0xe;
}

Assistant:

uint16_t ll_gw_scan_result_serialize(llabs_gateway_scan_results_t scan_result, const uint8_t num_gw,
                                     uint8_t buff[GW_SCAN_INFO_BUFF_SIZE])
{
    uint8_t *buff_cpy = buff;
    write_uint8(num_gw, &buff_cpy);
    write_uint64(scan_result.id, &buff_cpy);
    write_uint16(scan_result.rssi, &buff_cpy);
    write_uint8(scan_result.snr, &buff_cpy);
    write_uint8(scan_result.channel, &buff_cpy);
    write_uint8(scan_result.is_repeater, &buff_cpy);
    return buff_cpy - buff;
}